

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

void choose_src_profile(Context_conflict *ctx,char *srcprofile)

{
  int iVar1;
  
  ctx->source_profile = srcprofile;
  iVar1 = strcmp(srcprofile,"hlsl_vs_1_1");
  if (iVar1 != 0) {
    iVar1 = strcmp(srcprofile,"hlsl_vs_2_0");
    if (iVar1 != 0) {
      iVar1 = strcmp(srcprofile,"hlsl_vs_3_0");
      if (iVar1 != 0) {
        iVar1 = strcmp(srcprofile,"hlsl_ps_1_1");
        if (iVar1 != 0) {
          iVar1 = strcmp(srcprofile,"hlsl_ps_1_2");
          if (iVar1 != 0) {
            iVar1 = strcmp(srcprofile,"hlsl_ps_1_3");
            if (iVar1 != 0) {
              iVar1 = strcmp(srcprofile,"hlsl_ps_1_4");
              if (iVar1 != 0) {
                iVar1 = strcmp(srcprofile,"hlsl_ps_2_0");
                if (iVar1 != 0) {
                  iVar1 = strcmp(srcprofile,"hlsl_ps_3_0");
                  if (iVar1 != 0) {
                    failf(ctx,"%s","Unknown profile");
                    return;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void choose_src_profile(Context *ctx, const char *srcprofile)
{
    ctx->source_profile = srcprofile;

    #define TEST_PROFILE(x) if (strcmp(srcprofile, x) == 0) { return; }

    TEST_PROFILE(MOJOSHADER_SRC_PROFILE_HLSL_VS_1_1);
    TEST_PROFILE(MOJOSHADER_SRC_PROFILE_HLSL_VS_2_0);
    TEST_PROFILE(MOJOSHADER_SRC_PROFILE_HLSL_VS_3_0);
    TEST_PROFILE(MOJOSHADER_SRC_PROFILE_HLSL_PS_1_1);
    TEST_PROFILE(MOJOSHADER_SRC_PROFILE_HLSL_PS_1_2);
    TEST_PROFILE(MOJOSHADER_SRC_PROFILE_HLSL_PS_1_3);
    TEST_PROFILE(MOJOSHADER_SRC_PROFILE_HLSL_PS_1_4);
    TEST_PROFILE(MOJOSHADER_SRC_PROFILE_HLSL_PS_2_0);
    TEST_PROFILE(MOJOSHADER_SRC_PROFILE_HLSL_PS_3_0);

    #undef TEST_PROFILE

    fail(ctx, "Unknown profile");
}